

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speculative-simple.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  common_speculative_params params_00;
  llama_token *plVar1;
  llama_pos *plVar2;
  int32_t *piVar3;
  llama_seq_id **pplVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  undefined4 uVar8;
  common_log *pcVar9;
  ulong uVar10;
  pointer plVar11;
  pointer plVar12;
  pointer plVar13;
  size_type sVar14;
  reference piVar15;
  int *piVar16;
  float *pfVar17;
  iterator spec_00;
  iterator iVar18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> prompt_tgt_00;
  undefined8 uVar19;
  long lVar20;
  size_type sVar21;
  float fVar22;
  int n_input;
  int64_t t_dec_end;
  string token_str;
  size_t i_1;
  vector<int,_std::allocator<int>_> ids;
  size_t i;
  llama_tokens draft;
  int64_t t_dec_start;
  int64_t t_enc_end;
  llama_batch batch_tgt;
  common_speculative *spec;
  common_speculative_params params_spec;
  int n_past;
  llama_tokens prompt_tgt;
  llama_token id_last;
  common_sampler *smpl;
  int64_t t_enc_start;
  bool has_eos;
  int n_accept;
  int n_drafted;
  int n_predict;
  float p_min;
  int n_draft_min;
  int n_draft;
  int id;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> inp;
  common_init_result llama_init_dft;
  llama_vocab *vocab;
  common_init_result llama_init_tgt;
  llama_context *ctx_dft;
  llama_context *ctx_tgt;
  llama_model *model_tgt;
  common_params params;
  undefined4 in_stack_ffffffffffffe788;
  int32_t iVar23;
  undefined4 in_stack_ffffffffffffe78c;
  undefined4 uVar24;
  undefined4 in_stack_ffffffffffffe790;
  undefined4 in_stack_ffffffffffffe794;
  undefined4 in_stack_ffffffffffffe798;
  undefined4 uVar25;
  undefined4 in_stack_ffffffffffffe79c;
  undefined4 in_stack_ffffffffffffe7a0;
  llama_token in_stack_ffffffffffffe7a4;
  undefined4 in_stack_ffffffffffffe7a8;
  llama_pos pos;
  undefined2 in_stack_ffffffffffffe7ac;
  undefined2 uVar26;
  undefined1 in_stack_ffffffffffffe7ae;
  undefined1 uVar27;
  undefined1 in_stack_ffffffffffffe7af;
  undefined1 uVar28;
  undefined4 in_stack_ffffffffffffe7b0;
  undefined4 uVar29;
  undefined4 in_stack_ffffffffffffe7b4;
  undefined4 uVar30;
  llama_context *in_stack_ffffffffffffe7b8;
  allocator_type *__a;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe7c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffe7c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffe7d0;
  undefined8 in_stack_ffffffffffffe7f0;
  llama_tokens *in_stack_ffffffffffffe7f8;
  common_log *in_stack_ffffffffffffe800;
  common_sampler *in_stack_ffffffffffffe808;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *in_stack_ffffffffffffe828;
  undefined4 in_stack_ffffffffffffe830;
  undefined4 in_stack_ffffffffffffe834;
  llama_context *in_stack_ffffffffffffe8a0;
  undefined4 in_stack_ffffffffffffe8a8;
  undefined4 in_stack_ffffffffffffe8ac;
  pointer ctx_dft_00;
  string local_1668 [24];
  common_params *in_stack_ffffffffffffe9b0;
  ulong local_1648;
  vector<int,_std::allocator<int>_> local_1640;
  llama_batch local_1628;
  undefined4 local_15ec;
  undefined4 *local_15e8;
  undefined8 local_15e0;
  ulong local_15c0;
  undefined4 local_15b4;
  undefined4 *local_15b0;
  undefined8 local_15a8;
  undefined8 local_1588;
  float local_1580;
  undefined8 local_1578;
  float local_1570;
  vector<int,_std::allocator<int>_> local_1568;
  long local_1550;
  long local_1548;
  llama_batch local_1540;
  common_speculative *local_1508;
  common_speculative_params local_14fc;
  uint local_14f0;
  undefined8 in_stack_ffffffffffffeb44;
  undefined4 local_14b0;
  undefined4 uStack_14ac;
  undefined4 uStack_14a8;
  undefined4 uStack_14a4;
  undefined4 local_14a0;
  undefined4 uStack_149c;
  undefined4 uStack_1498;
  llama_token lStack_1494;
  llama_pos local_1490;
  undefined4 uStack_148c;
  undefined4 uStack_1488;
  undefined4 uStack_1484;
  allocator_type *local_1480;
  common_sampler *local_1478;
  long local_1470;
  byte local_1461;
  uint local_1460;
  uint local_145c;
  uint local_1458;
  float local_1454;
  int local_1450;
  uint local_144c;
  string local_1448 [24];
  common_params_sampling *in_stack_ffffffffffffebd0;
  undefined4 in_stack_ffffffffffffebd8;
  int in_stack_ffffffffffffebdc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1418;
  vector<int,_std::allocator<int>_> *local_1410;
  vector<int,_std::allocator<int>_> local_13f0 [2];
  undefined8 local_13b0;
  common_params *in_stack_ffffffffffffec68;
  int local_1368;
  int local_1358;
  undefined4 local_ca8;
  uint local_b5c;
  int local_b58;
  float local_b4c;
  _func_void_int_char_ptr_ptr *in_stack_fffffffffffffb20;
  llama_example in_stack_fffffffffffffb2c;
  common_params *in_stack_fffffffffffffb30;
  char **in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb40;
  byte local_33d;
  int local_4;
  
  common_params::common_params(in_stack_ffffffffffffe9b0);
  bVar5 = common_params_parse(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                              in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                              in_stack_fffffffffffffb20);
  if (bVar5) {
    if (local_1358 < -1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar9 = common_log_main();
        common_log_add(pcVar9,GGML_LOG_LEVEL_ERROR,"%s: --n-predict must be >= -1\n","main");
      }
      local_4 = 1;
    }
    else {
      common_init();
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        llama_backend_init();
        llama_numa_init(local_ca8);
        common_init_from_params(in_stack_ffffffffffffec68);
        plVar11 = std::unique_ptr<llama_model,_llama_model_deleter>::get
                            ((unique_ptr<llama_model,_llama_model_deleter> *)
                             CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790));
        plVar12 = std::unique_ptr<llama_context,_llama_context_deleter>::get
                            ((unique_ptr<llama_context,_llama_context_deleter> *)
                             CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790));
        local_13b0 = llama_model_get_vocab(plVar11);
        std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::operator=
                  ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                   CONCAT44(in_stack_ffffffffffffe834,in_stack_ffffffffffffe830),
                   in_stack_ffffffffffffe828);
        common_params_model::operator=
                  ((common_params_model *)
                   CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790),
                   (common_params_model *)
                   CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        common_init_from_params(in_stack_ffffffffffffec68);
        plVar13 = std::unique_ptr<llama_context,_llama_context_deleter>::get
                            ((unique_ptr<llama_context,_llama_context_deleter> *)
                             CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790));
        bVar5 = common_speculative_are_compatible
                          ((llama_context *)
                           CONCAT44(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8),
                           in_stack_ffffffffffffe8a0);
        if (bVar5) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)0x177498);
          common_tokenize(in_stack_ffffffffffffe7b8,
                          (string *)CONCAT44(in_stack_ffffffffffffe7b4,in_stack_ffffffffffffe7b0),
                          (bool)in_stack_ffffffffffffe7af,(bool)in_stack_ffffffffffffe7ae);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                     (vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffe79c,in_stack_ffffffffffffe798));
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
          uVar7 = llama_n_ctx(plVar12);
          sVar14 = std::vector<int,_std::allocator<int>_>::size(local_13f0);
          if (uVar7 < (uint)sVar14) {
            if (-1 < common_log_verbosity_thold) {
              pcVar9 = common_log_main();
              sVar14 = std::vector<int,_std::allocator<int>_>::size(local_13f0);
              uVar7 = llama_n_ctx(plVar12);
              common_log_add(pcVar9,GGML_LOG_LEVEL_ERROR,
                             "%s: the prompt exceeds the context size (%d tokens, ctx %d)\n","main",
                             sVar14 & 0xffffffff,(ulong)uVar7);
            }
            local_4 = 1;
          }
          else {
            uVar7 = llama_n_batch(plVar12);
            sVar14 = std::vector<int,_std::allocator<int>_>::size(local_13f0);
            if (uVar7 < (uint)sVar14) {
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                sVar14 = std::vector<int,_std::allocator<int>_>::size(local_13f0);
                uVar7 = llama_n_batch(plVar12);
                common_log_add(pcVar9,GGML_LOG_LEVEL_ERROR,
                               "%s: the prompt exceeds the batch size (%d tokens, batch %d)\n",
                               "main",sVar14 & 0xffffffff,(ulong)uVar7);
              }
              local_4 = 1;
            }
            else {
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_NONE,"\n\n");
              }
              local_1410 = local_13f0;
              local_1418._M_current =
                   (int *)std::vector<int,_std::allocator<int>_>::begin
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              while (bVar5 = __gnu_cxx::operator!=
                                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)CONCAT44(in_stack_ffffffffffffe794,
                                                    in_stack_ffffffffffffe790),
                                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)CONCAT44(in_stack_ffffffffffffe78c,
                                                    in_stack_ffffffffffffe788)), bVar5) {
                piVar15 = __gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator*(&local_1418);
                in_stack_ffffffffffffebdc = *piVar15;
                if (-1 < common_log_verbosity_thold) {
                  pcVar9 = common_log_main();
                  common_token_to_piece_abi_cxx11_
                            ((llama_context *)
                             CONCAT17(in_stack_ffffffffffffe7af,
                                      CONCAT16(in_stack_ffffffffffffe7ae,
                                               CONCAT24(in_stack_ffffffffffffe7ac,
                                                        in_stack_ffffffffffffe7a8))),
                             in_stack_ffffffffffffe7a4,
                             SUB41((uint)in_stack_ffffffffffffe7a0 >> 0x18,0));
                  uVar19 = std::__cxx11::string::c_str();
                  common_log_add(pcVar9,GGML_LOG_LEVEL_NONE,"%s",uVar19);
                  std::__cxx11::string::~string(local_1448);
                }
                __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++(&local_1418);
              }
              local_144c = local_b5c;
              local_1450 = local_b58;
              local_1454 = local_b4c;
              local_1458 = 0;
              local_145c = 0;
              local_1460 = 0;
              local_1461 = 0;
              local_1470 = ggml_time_us();
              local_1478 = common_sampler_init((llama_model *)
                                               CONCAT44(in_stack_ffffffffffffebdc,
                                                        in_stack_ffffffffffffebd8),
                                               in_stack_ffffffffffffebd0);
              ctx_dft_00 = plVar12;
              piVar16 = std::vector<int,_std::allocator<int>_>::data
                                  ((vector<int,_std::allocator<int>_> *)0x1778dd);
              sVar14 = std::vector<int,_std::allocator<int>_>::size(local_13f0);
              llama_batch_get_one(&local_14b0,piVar16,(int)sVar14 + -1);
              uVar26 = (undefined2)uStack_148c;
              uVar27 = (undefined1)((uint)uStack_148c >> 0x10);
              uVar28 = (undefined1)((uint)uStack_148c >> 0x18);
              llama_decode(ctx_dft_00);
              pfVar17 = (float *)std::vector<int,_std::allocator<int>_>::back
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(uStack_14a4,uStack_14a8));
              fVar22 = *pfVar17;
              spec_00 = std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(uStack_14ac,local_14b0));
              iVar18 = std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(uStack_14ac,local_14b0));
              prompt_tgt_00 =
                   __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator-((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(uStack_149c,local_14a0),CONCAT44(uStack_14a4,uStack_14a8));
              std::allocator<int>::allocator((allocator<int> *)0x1779c5);
              std::vector<int,std::allocator<int>>::
              vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                        (in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7d0,
                         in_stack_ffffffffffffe7c8,local_1480);
              std::allocator<int>::~allocator((allocator<int> *)0x1779f9);
              llama_n_ctx(plVar12);
              std::vector<int,_std::allocator<int>_>::reserve
                        (in_stack_ffffffffffffe7c0,(size_type)local_1480);
              sVar14 = std::vector<int,_std::allocator<int>_>::size(local_13f0);
              local_14f0 = (int)sVar14 - 1;
              common_speculative_params::common_speculative_params(&local_14fc);
              local_14fc.n_draft = local_144c;
              local_14fc.n_reuse = llama_n_ctx(plVar13);
              local_14fc.n_reuse = local_14fc.n_reuse - local_144c;
              local_14fc.p_min = local_1454;
              local_1508 = common_speculative_init(ctx_dft_00);
              uVar8 = llama_n_batch(plVar12);
              llama_batch_init(&local_1540,uVar8,0,1);
              local_1548 = ggml_time_us();
              local_1550 = ggml_time_us();
              uVar8 = uStack_149c;
              in_stack_ffffffffffffe7a0 = uStack_1498;
              in_stack_ffffffffffffe7a4 = lStack_1494;
              pos = local_1490;
              uVar29 = uStack_1488;
              uVar30 = uStack_1484;
              __a = local_1480;
              do {
                local_1570 = local_14fc.p_min;
                local_1588 = CONCAT44(local_14fc.n_reuse,local_14fc.n_draft);
                local_1580 = local_14fc.p_min;
                params_00.p_min = fVar22;
                params_00.n_draft = (int)in_stack_ffffffffffffeb44;
                params_00.n_reuse = (int)((ulong)in_stack_ffffffffffffeb44 >> 0x20);
                local_1578 = local_1588;
                common_speculative_gen_draft
                          ((common_speculative *)spec_00._M_current,params_00,
                           (llama_tokens *)prompt_tgt_00._M_current,
                           (llama_token)((ulong)iVar18._M_current >> 0x20));
                common_batch_clear(&local_1540);
                local_14f0 = local_14f0 + 1;
                local_15b4 = 0;
                local_15b0 = &local_15b4;
                local_15a8 = 1;
                std::allocator<int>::allocator((allocator<int> *)0x177c17);
                __l._M_len = (size_type)in_stack_ffffffffffffe7d0._M_current;
                __l._M_array = in_stack_ffffffffffffe7c8._M_current;
                std::vector<int,_std::allocator<int>_>::vector(in_stack_ffffffffffffe7c0,__l,__a);
                common_batch_add((llama_batch *)CONCAT44(uVar30,uVar29),
                                 CONCAT13(uVar28,CONCAT12(uVar27,uVar26)),pos,
                                 (vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                                 SUB41((uint)uVar8 >> 0x18,0));
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
                std::allocator<int>::~allocator((allocator<int> *)0x177c83);
                sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1568);
                if (sVar14 < (ulong)(long)local_1450) {
                  std::vector<int,_std::allocator<int>_>::clear
                            ((vector<int,_std::allocator<int>_> *)0x177cae);
                }
                local_15c0 = 0;
                while (uVar10 = local_15c0,
                      sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1568),
                      uVar10 < sVar14) {
                  std::vector<int,_std::allocator<int>_>::operator[](&local_1568,local_15c0);
                  local_15ec = 0;
                  local_15e8 = &local_15ec;
                  local_15e0 = 1;
                  std::allocator<int>::allocator((allocator<int> *)0x177e02);
                  __l_00._M_len = (size_type)in_stack_ffffffffffffe7d0._M_current;
                  __l_00._M_array = in_stack_ffffffffffffe7c8._M_current;
                  std::vector<int,_std::allocator<int>_>::vector
                            (in_stack_ffffffffffffe7c0,__l_00,__a);
                  common_batch_add((llama_batch *)CONCAT44(uVar30,uVar29),
                                   CONCAT13(uVar28,CONCAT12(uVar27,uVar26)),pos,
                                   (vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                                   SUB41((uint)uVar8 >> 0x18,0));
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
                  std::allocator<int>::~allocator((allocator<int> *)0x177e6e);
                  local_15c0 = local_15c0 + 1;
                }
                local_1628.logits = local_1540.logits;
                local_1628.n_seq_id = local_1540.n_seq_id;
                piVar3 = local_1628.n_seq_id;
                local_1628.seq_id = local_1540.seq_id;
                pplVar4 = local_1628.seq_id;
                local_1628.embd = local_1540.embd;
                pfVar17 = local_1628.embd;
                local_1628.pos = local_1540.pos;
                plVar2 = local_1628.pos;
                local_1628.n_tokens = local_1540.n_tokens;
                local_1628._4_4_ = local_1540._4_4_;
                uVar19 = local_1628._0_8_;
                local_1628.token = local_1540.token;
                plVar1 = local_1628.token;
                local_1628.n_tokens = local_1540.n_tokens;
                local_1628._4_4_ = local_1540._4_4_;
                local_1628.token._0_4_ = SUB84(local_1540.token,0);
                local_1628.token._4_4_ = (undefined4)((ulong)local_1540.token >> 0x20);
                local_1628.embd._0_4_ = SUB84(local_1540.embd,0);
                local_1628.embd._4_4_ = (undefined4)((ulong)local_1540.embd >> 0x20);
                local_1628.pos._0_4_ = SUB84(local_1540.pos,0);
                local_1628.pos._4_4_ = (llama_token)((ulong)local_1540.pos >> 0x20);
                local_1628.n_seq_id._0_4_ = (llama_pos)local_1540.n_seq_id;
                local_1628.seq_id._0_4_ = SUB84(local_1540.seq_id,0);
                local_1628.seq_id._4_4_ = (undefined4)((ulong)local_1540.seq_id >> 0x20);
                uVar26 = (undefined2)((ulong)local_1540.n_seq_id >> 0x20);
                uVar27 = (undefined1)((ulong)local_1540.n_seq_id >> 0x30);
                uVar28 = (undefined1)((ulong)local_1540.n_seq_id >> 0x38);
                iVar23 = local_1628.n_tokens;
                uVar24 = local_1628._4_4_;
                in_stack_ffffffffffffe790 = local_1628.token._0_4_;
                in_stack_ffffffffffffe794 = local_1628.token._4_4_;
                uVar25 = local_1628.embd._0_4_;
                uVar8 = local_1628.embd._4_4_;
                in_stack_ffffffffffffe7a0 = local_1628.pos._0_4_;
                in_stack_ffffffffffffe7a4 = local_1628.pos._4_4_;
                pos = (llama_pos)local_1628.n_seq_id;
                uVar29 = local_1628.seq_id._0_4_;
                uVar30 = local_1628.seq_id._4_4_;
                __a = (allocator_type *)local_1540.logits;
                local_1628._0_8_ = uVar19;
                local_1628.token = plVar1;
                local_1628.embd = pfVar17;
                local_1628.pos = plVar2;
                local_1628.n_seq_id = piVar3;
                local_1628.seq_id = pplVar4;
                llama_decode(plVar12);
                common_sampler_sample_and_accept_n
                          (in_stack_ffffffffffffe808,(llama_context *)in_stack_ffffffffffffe800,
                           in_stack_ffffffffffffe7f8,
                           SUB81((ulong)in_stack_ffffffffffffe7f0 >> 0x38,0));
                sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1640);
                if (sVar14 == 0) {
                  uVar19 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/speculative-simple/speculative-simple.cpp"
                                      ,0xb8,"GGML_ASSERT(%s) failed","ids.size() > 0");
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
                  common_init_result::~common_init_result
                            ((common_init_result *)
                             CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790));
                  common_init_result::~common_init_result
                            ((common_init_result *)
                             CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790));
                  common_params::~common_params
                            ((common_params *)
                             CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790));
                  _Unwind_Resume(uVar19);
                }
                sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1640);
                local_14f0 = local_14f0 + (int)sVar14 + -1;
                sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1568);
                local_145c = local_145c + (int)sVar14;
                sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1640);
                local_1460 = local_1460 + (int)sVar14 + -1;
                sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1640);
                local_1458 = local_1458 + (int)sVar14;
                for (local_1648 = 0;
                    sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1640),
                    local_1648 < sVar14; local_1648 = local_1648 + 1) {
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                             (value_type_conflict *)CONCAT44(uVar8,uVar25));
                  pfVar17 = (float *)std::vector<int,_std::allocator<int>_>::operator[]
                                               (&local_1640,local_1648);
                  fVar22 = *pfVar17;
                  bVar6 = llama_vocab_is_eog(local_13b0,fVar22);
                  if ((bVar6 & 1) != 0) {
                    local_1461 = 1;
                    break;
                  }
                  common_token_to_piece_abi_cxx11_
                            ((llama_context *)CONCAT17(uVar28,CONCAT16(uVar27,CONCAT24(uVar26,pos)))
                             ,in_stack_ffffffffffffe7a4,
                             SUB41((uint)in_stack_ffffffffffffe7a0 >> 0x18,0));
                  if (((local_33d & 1) == 0) ||
                     (sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1640),
                     sVar14 <= local_1648 + 1)) {
                    if (-1 < common_log_verbosity_thold) {
                      pcVar9 = common_log_main();
                      uVar19 = std::__cxx11::string::c_str();
                      common_log_add(pcVar9,GGML_LOG_LEVEL_NONE,"%s",uVar19);
                    }
                  }
                  else if (-1 < common_log_verbosity_thold) {
                    pcVar9 = common_log_main();
                    uVar19 = std::__cxx11::string::c_str();
                    common_log_add(pcVar9,GGML_LOG_LEVEL_NONE,"\x1b[%dm%s\x1b[37m",0x24,uVar19);
                  }
                  std::__cxx11::string::~string(local_1668);
                }
                if (0 < common_log_verbosity_thold) {
                  pcVar9 = common_log_main();
                  sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1640);
                  uVar7 = (int)sVar14 - 1;
                  sVar14 = std::vector<int,_std::allocator<int>_>::size(&local_1568);
                  common_log_add(pcVar9,GGML_LOG_LEVEL_DEBUG,
                                 "accepted %d/%d draft tokens, the last target token is: (%d)\n",
                                 (ulong)uVar7,sVar14 & 0xffffffff,(ulong)(uint)fVar22);
                }
                if (0 < common_log_verbosity_thold) {
                  pcVar9 = common_log_main();
                  common_log_add(pcVar9,GGML_LOG_LEVEL_DEBUG,
                                 "clear kv cache from any extra tokens, n_past = %d\n",
                                 (ulong)local_14f0);
                }
                llama_kv_self_seq_rm(plVar12,0,local_14f0,0xffffffff);
                if (((local_1358 < 0) || ((int)local_1458 <= local_1358)) && ((local_1461 & 1) == 0)
                   ) {
                  local_1368 = 0;
                }
                else {
                  local_1368 = 0x11;
                }
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
              } while (local_1368 == 0);
              lVar20 = ggml_time_us();
              sVar14 = std::vector<int,_std::allocator<int>_>::size(local_13f0);
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_NONE,"\n\n");
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                uVar8 = SUB84((double)((float)(local_1548 - local_1470) / 1e+06),0);
                sVar21 = std::vector<int,_std::allocator<int>_>::size(local_13f0);
                common_log_add(uVar8,SUB84((double)((float)sVar21 /
                                                   ((float)(local_1548 - local_1470) / 1e+06)),0),
                               (char *)pcVar9,2,
                               "encoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n",
                               sVar14 & 0xffffffff);
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                fVar22 = (float)(lVar20 - local_1550) / 1e+06;
                common_log_add(SUB84((double)fVar22,0),
                               SUB84((double)((float)(int)local_1458 / fVar22),0),(char *)pcVar9,2,
                               "decoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n");
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_INFO,"\n");
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_INFO,"n_draft   = %d\n",(ulong)local_144c);
              }
              if (-1 < common_log_verbosity_thold) {
                in_stack_ffffffffffffe800 = common_log_main();
                common_log_add(in_stack_ffffffffffffe800,GGML_LOG_LEVEL_INFO,"n_predict = %d\n",
                               (ulong)local_1458);
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_INFO,"n_drafted = %d\n",(ulong)local_145c);
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_INFO,"n_accept  = %d\n",(ulong)local_1460);
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(SUB84((double)(((float)(int)local_1460 * 100.0) /
                                             (float)(int)local_145c),0),(ggml_log_level)pcVar9,
                               (char *)0x2,"accept    = %.3f%%\n");
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_INFO,"\n");
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_INFO,"draft:\n\n");
              }
              llama_perf_context_print(plVar13);
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_INFO,"\n");
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_INFO,"target:\n\n");
              }
              common_perf_print((llama_context *)
                                CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790),
                                (common_sampler *)CONCAT44(uVar24,iVar23));
              common_sampler_free((common_sampler *)
                                  CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790));
              common_speculative_free((common_speculative *)in_stack_ffffffffffffe800);
              llama_backend_free();
              if (-1 < common_log_verbosity_thold) {
                pcVar9 = common_log_main();
                common_log_add(pcVar9,GGML_LOG_LEVEL_NONE,"\n\n");
              }
              local_4 = 0;
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
            }
          }
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
        }
        else {
          local_4 = 1;
        }
        common_init_result::~common_init_result
                  ((common_init_result *)
                   CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790));
        common_init_result::~common_init_result
                  ((common_init_result *)
                   CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790));
      }
      else {
        if (-1 < common_log_verbosity_thold) {
          pcVar9 = common_log_main();
          common_log_add(pcVar9,GGML_LOG_LEVEL_ERROR,"%s: --model-draft is required\n","main");
        }
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = 1;
  }
  common_params::~common_params
            ((common_params *)CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790));
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_SPECULATIVE)) {
        return 1;
    }

    if (params.n_predict < -1) {
        LOG_ERR("%s: --n-predict must be >= -1\n", __func__);
        return 1;
    }

    common_init();

    if (params.speculative.model.path.empty()) {
        LOG_ERR("%s: --model-draft is required\n", __func__);
        return 1;
    }

    // init llama.cpp
    llama_backend_init();
    llama_numa_init(params.numa);

    llama_model * model_tgt = NULL;
    //llama_model * model_dft = NULL;

    llama_context * ctx_tgt = NULL;
    llama_context * ctx_dft = NULL;

    // load the target model
    common_init_result llama_init_tgt = common_init_from_params(params);

    model_tgt = llama_init_tgt.model.get();
    ctx_tgt   = llama_init_tgt.context.get();

    const llama_vocab * vocab = llama_model_get_vocab(model_tgt);

    // load the draft model
    params.devices      = params.speculative.devices;
    params.model        = params.speculative.model;
    params.n_ctx        = params.speculative.n_ctx;
    params.n_batch      = params.speculative.n_ctx > 0 ? params.speculative.n_ctx : params.n_batch;
    params.n_gpu_layers = params.speculative.n_gpu_layers;

    if (params.speculative.cpuparams.n_threads > 0) {
        params.cpuparams.n_threads = params.speculative.cpuparams.n_threads;
    }

    params.cpuparams_batch.n_threads = params.speculative.cpuparams_batch.n_threads;
    common_init_result llama_init_dft = common_init_from_params(params);

    //model_dft = llama_init_dft.model.get();
    ctx_dft   = llama_init_dft.context.get();

    if (!common_speculative_are_compatible(ctx_tgt, ctx_dft)) {
        return 1;
    }

    // Tokenize the prompt
    std::vector<llama_token> inp;
    inp = common_tokenize(ctx_tgt, params.prompt, true, true);

    if (llama_n_ctx(ctx_tgt) < (uint32_t) inp.size()) {
        LOG_ERR("%s: the prompt exceeds the context size (%d tokens, ctx %d)\n", __func__, (int) inp.size(), llama_n_ctx(ctx_tgt));

        return 1;
    }

    if (llama_n_batch(ctx_tgt) < (uint32_t) inp.size()) {
        LOG_ERR("%s: the prompt exceeds the batch size (%d tokens, batch %d)\n", __func__, (int) inp.size(), llama_n_batch(ctx_tgt));

        return 1;
    }

    LOG("\n\n");

    for (auto id : inp) {
        LOG("%s", common_token_to_piece(ctx_tgt, id).c_str());
    }

    // how many tokens to draft each time
    int n_draft     = params.speculative.n_max;
    int n_draft_min = params.speculative.n_min;

    float p_min = params.speculative.p_min;

    int n_predict = 0;
    int n_drafted = 0;
    int n_accept  = 0;

    // used to determine end of generation
    bool has_eos = false;

    // ================================================
    // everything until here is standard initialization
    // the relevant stuff for speculative decoding starts here

    const auto t_enc_start = ggml_time_us();

    // target model sampling context
    struct common_sampler * smpl = common_sampler_init(model_tgt, params.sampling);

    // eval the prompt
    llama_decode(ctx_tgt, llama_batch_get_one(inp.data(), inp.size() - 1));

    // note: keep the last token separate!
    llama_token id_last = inp.back();

    // all tokens currently in the target context
    llama_tokens prompt_tgt(inp.begin(), inp.end() - 1);
    prompt_tgt.reserve(llama_n_ctx(ctx_tgt));

    int n_past = inp.size() - 1;

    // init the speculator
    struct common_speculative_params params_spec;
    params_spec.n_draft = n_draft;
    params_spec.n_reuse = llama_n_ctx(ctx_dft) - n_draft;
    params_spec.p_min   = p_min;

    struct common_speculative * spec = common_speculative_init(ctx_dft);

    llama_batch batch_tgt = llama_batch_init(llama_n_batch(ctx_tgt), 0, 1);

    const auto t_enc_end = ggml_time_us();

    const auto t_dec_start = ggml_time_us();

    while (true) {
        // optionally, generate draft tokens that can be appended to the target batch
        //
        // this is the most important part of the speculation. the more probable tokens that are provided here
        // the better the performance will be. in theory, this computation can be performed asynchronously and even
        // offloaded to a remote device. it doesn't even have to be based on an LLM. instead, it can provide tokens
        // from a cache or lookup tables.
        //
        llama_tokens draft = common_speculative_gen_draft(spec, params_spec, prompt_tgt, id_last);

        //LOG_DBG("draft: %s\n", string_from(ctx_dft, draft).c_str());

        // always have a token to evaluate from before - id_last
        common_batch_clear(batch_tgt);
        common_batch_add  (batch_tgt, id_last, n_past++, { 0 }, true);

        // evaluate the target model on [id_last, draft0, draft1, ..., draftN-1]
        {
            // do not waste time on small drafts
            if (draft.size() < (size_t) n_draft_min) {
                draft.clear();
            }

            for (size_t i = 0; i < draft.size(); ++i) {
                common_batch_add(batch_tgt, draft[i], n_past + i, { 0 }, true);
            }

            //LOG_DBG("target batch: %s\n", string_from(ctx_tgt, batch_tgt).c_str());

            llama_decode(ctx_tgt, batch_tgt);
        }

        // sample from the full target batch and return the accepted tokens based on the target sampler
        //
        // for each token to be accepted, the sampler would have to sample that same token
        // in such cases, instead of decoding the sampled token as we normally do, we simply continue with the
        // available logits from the batch and sample the next token until we run out of logits or the sampler
        // disagrees with the draft
        //
        const auto ids = common_sampler_sample_and_accept_n(smpl, ctx_tgt, draft);

        //LOG_DBG("ids: %s\n", string_from(ctx_tgt, ids).c_str());

        GGML_ASSERT(ids.size() > 0); // there will always be at least one accepted token

        n_past    += ids.size() - 1;
        n_drafted += draft.size(); // note: we ignore the discarded small drafts
        n_accept  += ids.size() - 1;
        n_predict += ids.size();

        // process the accepted tokens and update contexts
        //
        // this is the standard token post-processing that we normally do
        // in this case, we do it for a group of accepted tokens at once
        //
        for (size_t i = 0; i < ids.size(); ++i) {
            prompt_tgt.push_back(id_last);

            id_last = ids[i];

            if (llama_vocab_is_eog(vocab, id_last)) {
                has_eos = true;
                break;
            }

            const std::string token_str = common_token_to_piece(ctx_tgt, id_last);

            if (params.use_color && i + 1 < ids.size()) {
                LOG("\u001b[%dm%s\u001b[37m", (36 - 0 % 6), token_str.c_str());
            } else {
                LOG("%s", token_str.c_str());
            }
        }

        LOG_DBG("accepted %d/%d draft tokens, the last target token is: (%d)\n", (int) ids.size() - 1, (int) draft.size(), id_last);

        {
            LOG_DBG("clear kv cache from any extra tokens, n_past = %d\n", n_past);

            llama_kv_self_seq_rm(ctx_tgt, 0, n_past, -1);
        }

        if ((params.n_predict >= 0 && n_predict > params.n_predict) || has_eos) {
            break;
        }
    }

    auto t_dec_end = ggml_time_us();

    const int n_input = inp.size();

    LOG("\n\n");

    LOG_INF("encoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n", n_input,   (t_enc_end - t_enc_start) / 1e6f, inp.size() / ((t_enc_end - t_enc_start) / 1e6f));
    LOG_INF("decoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n", n_predict, (t_dec_end - t_dec_start) / 1e6f, n_predict  / ((t_dec_end - t_dec_start) / 1e6f));

    LOG_INF("\n");
    LOG_INF("n_draft   = %d\n", n_draft);
    LOG_INF("n_predict = %d\n", n_predict);
    LOG_INF("n_drafted = %d\n", n_drafted);
    LOG_INF("n_accept  = %d\n", n_accept);
    LOG_INF("accept    = %.3f%%\n", 100.0f * n_accept / n_drafted);

    LOG_INF("\n");
    LOG_INF("draft:\n\n");

    llama_perf_context_print(ctx_dft);

    LOG_INF("\n");
    LOG_INF("target:\n\n");
    common_perf_print(ctx_tgt, smpl);

    common_sampler_free(smpl);
    common_speculative_free(spec);

    llama_backend_free();

    LOG("\n\n");

    return 0;
}